

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool __thiscall cmGeneratorTarget::HaveWellDefinedOutputFiles(cmGeneratorTarget *this)

{
  TargetType TVar1;
  bool bVar2;
  
  TVar1 = cmTarget::GetType(this->Target);
  bVar2 = true;
  if (TVar1 != STATIC_LIBRARY) {
    TVar1 = cmTarget::GetType(this->Target);
    if (TVar1 != SHARED_LIBRARY) {
      TVar1 = cmTarget::GetType(this->Target);
      if (TVar1 != MODULE_LIBRARY) {
        TVar1 = cmTarget::GetType(this->Target);
        if (TVar1 != OBJECT_LIBRARY) {
          TVar1 = cmTarget::GetType(this->Target);
          bVar2 = TVar1 == EXECUTABLE;
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool cmGeneratorTarget::HaveWellDefinedOutputFiles() const
{
  return this->GetType() == cmStateEnums::STATIC_LIBRARY ||
    this->GetType() == cmStateEnums::SHARED_LIBRARY ||
    this->GetType() == cmStateEnums::MODULE_LIBRARY ||
    this->GetType() == cmStateEnums::OBJECT_LIBRARY ||
    this->GetType() == cmStateEnums::EXECUTABLE;
}